

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  FILE *this_00;
  value_type expression_text;
  key_type actual_predicate_value;
  size_type sVar5;
  value_type this_01;
  key_type kVar6;
  char *message;
  AssertionResult *this_02;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff958;
  int in_stack_fffffffffffff95c;
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff960;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff968;
  allocator_type *in_stack_fffffffffffff970;
  key_equal *in_stack_fffffffffffff978;
  int iVar7;
  hasher *in_stack_fffffffffffff980;
  size_type in_stack_fffffffffffff988;
  Type TVar8;
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  char *in_stack_fffffffffffff9d0;
  undefined6 in_stack_fffffffffffff9d8;
  undefined1 in_stack_fffffffffffff9de;
  undefined1 in_stack_fffffffffffff9df;
  value_type in_stack_fffffffffffff9f8;
  string local_5c8 [52];
  key_type local_594;
  undefined1 local_589;
  AssertionResult local_588;
  string local_578 [16];
  value_type *in_stack_fffffffffffffa98;
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaa0;
  AssertionResult local_538 [2];
  key_type local_518;
  value_type local_4c0;
  AssertionResult local_4b8;
  string local_4a8 [52];
  key_type local_474;
  undefined1 local_469;
  AssertionResult local_468 [2];
  key_type local_448;
  value_type local_3f0;
  AssertionResult local_3e8 [2];
  key_type local_3c8;
  value_type local_370;
  AssertionResult local_368;
  string local_358 [55];
  undefined1 local_321;
  AssertionResult local_320;
  string local_310 [55];
  undefined1 local_2d9;
  AssertionResult local_2d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_2c8 [2];
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_2a0;
  string local_1f8 [55];
  undefined1 local_1c1;
  AssertionResult local_1c0;
  string local_1b0 [55];
  undefined1 local_179;
  AssertionResult local_178;
  FILE *local_168;
  key_type local_160;
  key_type local_158;
  value_type local_f8;
  int local_f0;
  key_type local_ec;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d8 [2];
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_b0;
  
  bVar1 = google::
          HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
               in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d8);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    local_ec = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffff960,
                      (key_type *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    for (local_f0 = 1; local_f0 < 100; local_f0 = local_f0 + 1) {
      in_stack_fffffffffffff9f8 =
           HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),0);
      local_f8 = in_stack_fffffffffffff9f8;
      google::
      BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    }
    local_158 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff968,
                            (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff960,
            (key_type *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    local_160 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff968,
                            (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff960,
            (key_type *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    this_00 = tmpfile();
    local_179 = this_00 != (FILE *)0x0;
    local_168 = this_00;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,
               (bool *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (type *)0xf54ffb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)
                 CONCAT17(in_stack_fffffffffffff9df,
                          CONCAT16(in_stack_fffffffffffff9de,in_stack_fffffffffffff9d8)),
                 in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,(Type)(in_stack_fffffffffffff988 >> 0x20)
                 ,(char *)in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                 (char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffff9df,
                          CONCAT16(in_stack_fffffffffffff9de,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_1b0);
      testing::Message::~Message((Message *)0xf550be);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55152);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<ValueSerializer,_IO_FILE>(&local_b0,local_168);
    local_1c1 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,
               (bool *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (type *)0xf55199);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9de,in_stack_fffffffffffff9d8)),
                 in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,(Type)(in_stack_fffffffffffff988 >> 0x20)
                 ,(char *)in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                 (char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9de,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_1f8);
      testing::Message::~Message((Message *)0xf5526e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55305);
    rewind(local_168);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_2c8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
               in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    TVar8 = (Type)(in_stack_fffffffffffff988 >> 0x20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_2c8);
    local_2d9 = local_168 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,
               (bool *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (type *)0xf553ad);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9de,in_stack_fffffffffffff9d8)),
                 in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9de,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_310);
      testing::Message::~Message((Message *)0xf554c1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55555);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::unserialize<ValueSerializer,_IO_FILE>(&local_2a0,local_168);
    local_321 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,
               (bool *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (type *)0xf5559c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_320);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)),
                 in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_358);
      testing::Message::~Message((Message *)0xf55671);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55708);
    fclose(local_168);
    expression_text =
         HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),0);
    local_370 = expression_text;
    actual_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    local_3c8 = actual_predicate_value;
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)kVar4,(key_type *)in_stack_fffffffffffff9f8);
    google::
    sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf5578f);
    testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (pair<int,_int> *)in_stack_fffffffffffff968,
               (pair<int,_int> *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_368);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      in_stack_fffffffffffff9c0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf557fd);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf5585a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf558cb);
    local_3f0 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),0);
    local_448 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff968,
                            (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)kVar4,(key_type *)in_stack_fffffffffffff9f8);
    google::
    sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf55943);
    testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (pair<int,_int> *)in_stack_fffffffffffff968,
               (pair<int,_int> *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::AssertionResult::failure_message((AssertionResult *)0xf559b1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf55a0e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55a7f);
    local_474 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff968,
                            (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    sVar5 = google::
            BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(in_stack_fffffffffffff960,
                    (key_type *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    local_469 = sVar5 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,
               (bool *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (type *)0xf55aea);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_468);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)),
                 (char *)expression_text,(char *)actual_predicate_value,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_4a8);
      testing::Message::~Message((Message *)0xf55bbf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55c56);
    this_01 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),0);
    local_4c0 = this_01;
    kVar6 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    local_518 = kVar6;
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)kVar4,(key_type *)in_stack_fffffffffffff9f8);
    TVar8 = kVar6.second;
    google::
    sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf55cce);
    testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (pair<int,_int> *)in_stack_fffffffffffff968,
               (pair<int,_int> *)in_stack_fffffffffffff960);
    iVar7 = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      in_stack_fffffffffffff980 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xf55d3c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,TVar8,(char *)in_stack_fffffffffffff980,iVar7,
                 (char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf55d99);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55e0a);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    iVar7 = kVar4.second;
    message = (char *)google::
                      BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count(in_stack_fffffffffffff960,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,
               (bool *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (type *)0xf55e75);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_538);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)),
                 (char *)expression_text,(char *)actual_predicate_value,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,TVar8,(char *)in_stack_fffffffffffff980,iVar7,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_578);
      testing::Message::~Message((Message *)0xf55f4a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf55fe1);
    local_594 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff968,
                            (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    this_02 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff960,
                      (key_type *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    local_589 = this_02 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_02,(bool *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (type *)0xf5604c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_588);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)),
                 (char *)expression_text,(char *)actual_predicate_value,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,TVar8,(char *)in_stack_fffffffffffff980,iVar7,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
      std::__cxx11::string::~string(local_5c8);
      testing::Message::~Message((Message *)0xf56121);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf561b5);
    google::
    HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf561c2);
    google::
    HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf561cf);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}